

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStridingMeshInterface.cpp
# Opt level: O3

char * __thiscall
btStridingMeshInterface::serialize
          (btStridingMeshInterface *this,void *dataBuffer,btSerializer *serializer)

{
  int i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  uchar *puVar5;
  char *pcVar6;
  undefined4 *puVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  int numtriangles;
  int numverts;
  int indexstride;
  int stride;
  uchar *indexbase;
  uint local_54;
  PHY_ScalarType gfxindextype;
  PHY_ScalarType type;
  uchar *vertexbase;
  long local_40;
  void *local_38;
  
  iVar1 = (*this->_vptr_btStridingMeshInterface[7])();
  *(int *)((long)dataBuffer + 0x18) = iVar1;
  *(undefined8 *)dataBuffer = 0;
  if (iVar1 != 0) {
    local_40 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x38,iVar1);
    puVar12 = *(undefined8 **)(local_40 + 8);
    uVar2 = (**(code **)(*(long *)serializer + 0x38))(serializer,puVar12);
    *(undefined8 *)dataBuffer = uVar2;
    local_38 = dataBuffer;
    local_54 = (*this->_vptr_btStridingMeshInterface[7])(this);
    if (0 < (int)local_54) {
      uVar11 = 0;
      do {
        (*this->_vptr_btStridingMeshInterface[4])
                  (this,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,&numtriangles,
                   &gfxindextype,uVar11);
        *(int *)(puVar12 + 6) = numtriangles;
        *(int *)((long)puVar12 + 0x34) = numverts;
        *puVar12 = 0;
        puVar12[1] = 0;
        puVar12[2] = 0;
        puVar12[3] = 0;
        puVar12[4] = 0;
        puVar12[5] = 0;
        if (gfxindextype == PHY_UCHAR) {
          if (numtriangles != 0) {
            lVar3 = (**(code **)(*(long *)serializer + 0x20))(serializer,4);
            lVar4 = *(long *)(lVar3 + 8);
            uVar2 = (**(code **)(*(long *)serializer + 0x38))(serializer,lVar4);
            puVar12[4] = uVar2;
            if (0 < numtriangles) {
              lVar8 = 0;
              do {
                lVar9 = (long)(int)lVar8 * (long)indexstride;
                *(uchar *)(lVar4 + lVar8 * 4) = indexbase[lVar9];
                *(uchar *)(lVar4 + 1 + lVar8 * 4) = indexbase[lVar9 + 1];
                *(uchar *)(lVar4 + 2 + lVar8 * 4) = indexbase[lVar9 + 2];
                lVar8 = lVar8 + 1;
              } while (lVar8 < numtriangles);
            }
            uVar2 = *(undefined8 *)(lVar3 + 8);
            lVar4 = *(long *)serializer;
            pcVar6 = "btCharIndexTripletData";
            goto LAB_0016ae04;
          }
        }
        else if (gfxindextype == PHY_SHORT) {
          if (numtriangles != 0) {
            lVar3 = (**(code **)(*(long *)serializer + 0x20))(serializer,8);
            lVar4 = *(long *)(lVar3 + 8);
            uVar2 = (**(code **)(*(long *)serializer + 0x38))(serializer);
            puVar12[3] = uVar2;
            if (0 < (long)numtriangles) {
              puVar5 = indexbase + 4;
              lVar8 = 0;
              do {
                *(undefined2 *)(lVar4 + lVar8 * 8) = *(undefined2 *)(puVar5 + -4);
                *(undefined2 *)(lVar4 + 2 + lVar8 * 8) = *(undefined2 *)(puVar5 + -2);
                *(undefined2 *)(lVar4 + 4 + lVar8 * 8) = *(undefined2 *)puVar5;
                lVar8 = lVar8 + 1;
                puVar5 = puVar5 + indexstride;
              } while (numtriangles != lVar8);
            }
            uVar2 = *(undefined8 *)(lVar3 + 8);
            lVar4 = *(long *)serializer;
            pcVar6 = "btShortIntIndexTripletData";
            goto LAB_0016ae04;
          }
        }
        else if ((gfxindextype == PHY_INTEGER) && (numtriangles != 0)) {
          lVar3 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,numtriangles * 3);
          lVar4 = *(long *)(lVar3 + 8);
          uVar2 = (**(code **)(*(long *)serializer + 0x38))(serializer,lVar4);
          puVar12[2] = uVar2;
          if (0 < numtriangles) {
            puVar7 = (undefined4 *)(lVar4 + 8);
            lVar4 = 0;
            do {
              lVar8 = (long)(int)lVar4 * (long)indexstride;
              puVar7[-2] = *(undefined4 *)(indexbase + lVar8);
              puVar7[-1] = *(undefined4 *)(indexbase + lVar8 + 4);
              *puVar7 = *(undefined4 *)(indexbase + lVar8 + 8);
              lVar4 = lVar4 + 1;
              puVar7 = puVar7 + 3;
            } while (lVar4 < numtriangles);
          }
          uVar2 = *(undefined8 *)(lVar3 + 8);
          lVar4 = *(long *)serializer;
          pcVar6 = "btIntIndexData";
LAB_0016ae04:
          (**(code **)(lVar4 + 0x28))(serializer,lVar3,pcVar6,0x59415241,uVar2);
        }
        if (type == PHY_DOUBLE) {
          if (numverts != 0) {
            lVar3 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x20);
            lVar4 = *(long *)(lVar3 + 8);
            uVar2 = (**(code **)(*(long *)serializer + 0x38))(serializer);
            puVar12[1] = uVar2;
            if (0 < (long)numverts) {
              puVar5 = vertexbase + 0x10;
              lVar8 = 0;
              do {
                *(undefined8 *)(lVar4 + lVar8) = *(undefined8 *)(puVar5 + -0x10);
                *(undefined8 *)(lVar4 + 8 + lVar8) = *(undefined8 *)(puVar5 + -8);
                *(undefined8 *)(lVar4 + 0x10 + lVar8) = *(undefined8 *)puVar5;
                puVar5 = puVar5 + stride;
                lVar8 = lVar8 + 0x20;
              } while ((long)numverts * 0x20 != lVar8);
            }
            uVar2 = *(undefined8 *)(lVar3 + 8);
            lVar4 = *(long *)serializer;
            pcVar6 = "btVector3DoubleData";
            goto LAB_0016af42;
          }
        }
        else if ((type == PHY_FLOAT) && (numverts != 0)) {
          lVar3 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10);
          lVar4 = *(long *)(lVar3 + 8);
          uVar2 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          *puVar12 = uVar2;
          if (0 < (long)numverts) {
            puVar5 = vertexbase + 8;
            lVar8 = 0;
            do {
              *(undefined4 *)(lVar4 + lVar8) = *(undefined4 *)(puVar5 + -8);
              *(undefined4 *)(lVar4 + 4 + lVar8) = *(undefined4 *)(puVar5 + -4);
              *(undefined4 *)(lVar4 + 8 + lVar8) = *(undefined4 *)puVar5;
              puVar5 = puVar5 + stride;
              lVar8 = lVar8 + 0x10;
            } while ((long)numverts * 0x10 != lVar8);
          }
          uVar2 = *(undefined8 *)(lVar3 + 8);
          lVar4 = *(long *)serializer;
          pcVar6 = "btVector3FloatData";
LAB_0016af42:
          (**(code **)(lVar4 + 0x28))(serializer,lVar3,pcVar6,0x59415241,uVar2);
        }
        (*this->_vptr_btStridingMeshInterface[6])(this,uVar11);
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
        puVar12 = puVar12 + 7;
      } while (uVar10 != local_54);
    }
    (**(code **)(*(long *)serializer + 0x28))
              (serializer,local_40,"btMeshPartData",0x59415241,*(undefined8 *)(local_40 + 8));
    dataBuffer = local_38;
  }
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 8) = (this->m_scaling).m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return "btStridingMeshInterfaceData";
}

Assistant:

const char*	btStridingMeshInterface::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btStridingMeshInterfaceData* trimeshData = (btStridingMeshInterfaceData*) dataBuffer;

	trimeshData->m_numMeshParts = getNumSubParts();

	//void* uniquePtr = 0;

	trimeshData->m_meshPartsPtr = 0;

	if (trimeshData->m_numMeshParts)
	{
		btChunk* chunk = serializer->allocate(sizeof(btMeshPartData),trimeshData->m_numMeshParts);
		btMeshPartData* memPtr = (btMeshPartData*)chunk->m_oldPtr;
		trimeshData->m_meshPartsPtr = (btMeshPartData *)serializer->getUniquePointer(memPtr);


	//	int numtotalphysicsverts = 0;
		int part,graphicssubparts = getNumSubParts();
		const unsigned char * vertexbase;
		const unsigned char * indexbase;
		int indexstride;
		PHY_ScalarType type;
		PHY_ScalarType gfxindextype;
		int stride,numverts,numtriangles;
		int gfxindex;
	//	btVector3 triangle[3];

	//	btVector3 meshScaling = getScaling();

		///if the number of parts is big, the performance might drop due to the innerloop switch on indextype
		for (part=0;part<graphicssubparts ;part++,memPtr++)
		{
			getLockedReadOnlyVertexIndexBase(&vertexbase,numverts,type,stride,&indexbase,indexstride,numtriangles,gfxindextype,part);
			memPtr->m_numTriangles = numtriangles;//indices = 3*numtriangles
			memPtr->m_numVertices = numverts;
			memPtr->m_indices16 = 0;
			memPtr->m_indices32 = 0;
			memPtr->m_3indices16 = 0;
			memPtr->m_3indices8 = 0;
			memPtr->m_vertices3f = 0;
			memPtr->m_vertices3d = 0;


			switch (gfxindextype)
			{
			case PHY_INTEGER:
				{
					int numindices = numtriangles*3;
				
					if (numindices)
					{
						btChunk* chunk = serializer->allocate(sizeof(btIntIndexData),numindices);
						btIntIndexData* tmpIndices = (btIntIndexData*)chunk->m_oldPtr;
						memPtr->m_indices32 = (btIntIndexData*)serializer->getUniquePointer(tmpIndices);
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
							tmpIndices[gfxindex*3].m_value = tri_indices[0];
							tmpIndices[gfxindex*3+1].m_value = tri_indices[1];
							tmpIndices[gfxindex*3+2].m_value = tri_indices[2];
						}
						serializer->finalizeChunk(chunk,"btIntIndexData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}
			case PHY_SHORT:
				{
					if (numtriangles)
					{
						btChunk* chunk = serializer->allocate(sizeof(btShortIntIndexTripletData),numtriangles);
						btShortIntIndexTripletData* tmpIndices = (btShortIntIndexTripletData*)chunk->m_oldPtr;
						memPtr->m_3indices16 = (btShortIntIndexTripletData*) serializer->getUniquePointer(tmpIndices);
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
							tmpIndices[gfxindex].m_values[0] = tri_indices[0];
							tmpIndices[gfxindex].m_values[1] = tri_indices[1];
							tmpIndices[gfxindex].m_values[2] = tri_indices[2];
						}
						serializer->finalizeChunk(chunk,"btShortIntIndexTripletData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}
				case PHY_UCHAR:
				{
					if (numtriangles)
					{
						btChunk* chunk = serializer->allocate(sizeof(btCharIndexTripletData),numtriangles);
						btCharIndexTripletData* tmpIndices = (btCharIndexTripletData*)chunk->m_oldPtr;
						memPtr->m_3indices8 = (btCharIndexTripletData*) serializer->getUniquePointer(tmpIndices);
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
							tmpIndices[gfxindex].m_values[0] = tri_indices[0];
							tmpIndices[gfxindex].m_values[1] = tri_indices[1];
							tmpIndices[gfxindex].m_values[2] = tri_indices[2];
						}
						serializer->finalizeChunk(chunk,"btCharIndexTripletData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}
			default:
				{
					btAssert(0);
					//unknown index type
				}
			}

			switch (type)
			{
			case PHY_FLOAT:
			 {
				 float* graphicsbase;

				 if (numverts)
				 {
					 btChunk* chunk = serializer->allocate(sizeof(btVector3FloatData),numverts);
					 btVector3FloatData* tmpVertices = (btVector3FloatData*) chunk->m_oldPtr;
					 memPtr->m_vertices3f = (btVector3FloatData *)serializer->getUniquePointer(tmpVertices);
					 for (int i=0;i<numverts;i++)
					 {
						 graphicsbase = (float*)(vertexbase+i*stride);
						 tmpVertices[i].m_floats[0] = graphicsbase[0];
						 tmpVertices[i].m_floats[1] = graphicsbase[1];
						 tmpVertices[i].m_floats[2] = graphicsbase[2];
					 }
					 serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
				 }
				 break;
				}

			case PHY_DOUBLE:
				{
					if (numverts)
					{
						btChunk* chunk = serializer->allocate(sizeof(btVector3DoubleData),numverts);
						btVector3DoubleData* tmpVertices = (btVector3DoubleData*) chunk->m_oldPtr;
						memPtr->m_vertices3d = (btVector3DoubleData *) serializer->getUniquePointer(tmpVertices);
						for (int i=0;i<numverts;i++)
					 {
						 double* graphicsbase = (double*)(vertexbase+i*stride);//for now convert to float, might leave it at double
						 tmpVertices[i].m_floats[0] = graphicsbase[0];
						 tmpVertices[i].m_floats[1] = graphicsbase[1];
						 tmpVertices[i].m_floats[2] = graphicsbase[2];
					 }
						serializer->finalizeChunk(chunk,"btVector3DoubleData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}

			default:
				btAssert((type == PHY_FLOAT) || (type == PHY_DOUBLE));
			}

			unLockReadOnlyVertexBase(part);
		}

		serializer->finalizeChunk(chunk,"btMeshPartData",BT_ARRAY_CODE,chunk->m_oldPtr);
	}


	m_scaling.serializeFloat(trimeshData->m_scaling);
	return "btStridingMeshInterfaceData";
}